

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O2

void __thiscall Funcdata::totalReplaceConstant(Funcdata *this,Varnode *vn,uintb val)

{
  _List_node_base *p_Var1;
  PcodeOp *this_00;
  BlockBasic *bl;
  int4 slot;
  _Self __tmp;
  Varnode *vn_00;
  Varnode *pVVar2;
  _List_node_base *p_Var3;
  PcodeOp *local_60;
  Address local_40;
  
  local_60 = (PcodeOp *)0x0;
  p_Var3 = (vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&vn->descend) {
    p_Var1 = p_Var3->_M_next;
    this_00 = (PcodeOp *)p_Var3[1]._M_next;
    slot = PcodeOp::getSlot(this_00,vn);
    if ((this_00->flags & 0x40) == 0) {
      vn_00 = newConstant(this,vn->size,val);
    }
    else if (local_60 == (PcodeOp *)0x0) {
      if ((vn->flags & 0x10) == 0) {
        bl = (BlockBasic *)
             *(this->bblocks).list.super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
        (*(bl->super_FlowBlock)._vptr_FlowBlock[2])(&local_40);
        local_60 = newOp(this,1,&local_40);
        opSetOpcode(this,local_60,CPUI_COPY);
        vn_00 = newUniqueOut(this,vn->size,local_60);
        pVVar2 = newConstant(this,vn->size,val);
        opSetInput(this,local_60,pVVar2,0);
        opInsertBegin(this,local_60,bl);
      }
      else {
        local_60 = newOp(this,1,&(vn->def->start).pc);
        opSetOpcode(this,local_60,CPUI_COPY);
        vn_00 = newUniqueOut(this,vn->size,local_60);
        pVVar2 = newConstant(this,vn->size,val);
        opSetInput(this,local_60,pVVar2,0);
        opInsertAfter(this,local_60,vn->def);
      }
    }
    else {
      vn_00 = local_60->output;
    }
    opSetInput(this,this_00,vn_00,slot);
    p_Var3 = p_Var1;
  }
  return;
}

Assistant:

void Funcdata::totalReplaceConstant(Varnode *vn,uintb val)

{
  list<PcodeOp *>::const_iterator iter;
  PcodeOp *op;
  PcodeOp *copyop = (PcodeOp *)0;
  Varnode *newrep;
  int4 i;

  iter = vn->beginDescend();
  while(iter != vn->endDescend()) {
    op = *iter++;		// Increment before removing descendant
    i = op->getSlot(vn);
    if (op->isMarker()) {    // Do not put constant directly in marker
      if (copyop == (PcodeOp *)0) {
	if (vn->isWritten()) {
	  copyop = newOp(1,vn->getDef()->getAddr());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertAfter(copyop,vn->getDef());
	}
	else {
	  BlockBasic *bb = (BlockBasic *)getBasicBlocks().getBlock(0);
	  copyop = newOp(1,bb->getStart());
	  opSetOpcode(copyop,CPUI_COPY);
	  newrep = newUniqueOut(vn->getSize(),copyop);
	  opSetInput(copyop,newConstant(vn->getSize(),val),0);
	  opInsertBegin(copyop,bb);
	}
      }
      else
	newrep = copyop->getOut();
    }
    else
      newrep = newConstant(vn->getSize(),val);
    opSetInput(op,newrep,i);
  }
}